

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::numtostr::x_write<long>(numtostr *this,long x)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  if (x == 0) {
    (this->m_buf)._M_elems[0] = '0';
    return;
  }
  uVar3 = 0;
  lVar1 = x;
  while( true ) {
    if (lVar1 == 0) {
      if (x < 0) {
        if (0x3d < uVar3) {
          __assert_fail("i < m_buf.size() - 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                        ,0x206b,
                        "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::true_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = long]"
                       );
        }
        (this->m_buf)._M_elems[uVar3] = '-';
        uVar3 = uVar3 + 1;
      }
      std::__reverse<char*>(this,(this->m_buf)._M_elems + uVar3);
      return;
    }
    if (uVar3 == 0x3f) break;
    lVar2 = lVar1 % 10;
    lVar4 = -lVar2;
    if (0 < lVar2) {
      lVar4 = lVar2;
    }
    (this->m_buf)._M_elems[uVar3] = (char)lVar4 + '0';
    uVar3 = uVar3 + 1;
    lVar1 = lVar1 / 10;
  }
  __assert_fail("x == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                ,0x2066,
                "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::true_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = long]"
               );
}

Assistant:

void x_write(NumberType x, /*is_integral=*/std::true_type)
        {
            // special case for "0"
            if (x == 0)
            {
                m_buf[0] = '0';
                return;
            }

            const bool is_negative = x < 0;
            size_t i = 0;

            // spare 1 byte for '\0'
            while (x != 0 and i < m_buf.size() - 1)
            {
                const auto digit = std::labs(static_cast<long>(x % 10));
                m_buf[i++] = static_cast<char>('0' + digit);
                x /= 10;
            }

            // make sure the number has been processed completely
            assert(x == 0);

            if (is_negative)
            {
                // make sure there is capacity for the '-'
                assert(i < m_buf.size() - 2);
                m_buf[i++] = '-';
            }

            std::reverse(m_buf.begin(), m_buf.begin() + i);
        }